

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O0

array<int,_6UL> * __thiscall
MeteomaticsApiClient::addDayToToday
          (array<int,_6UL> *__return_storage_ptr__,MeteomaticsApiClient *this,int days)

{
  int iVar1;
  value_type_conflict2 vVar2;
  reference pvVar3;
  time_t local_38;
  time_t later_time;
  tm *Tm;
  time_t local_20;
  time_t ltime;
  MeteomaticsApiClient *pMStack_10;
  int days_local;
  MeteomaticsApiClient *this_local;
  
  ltime._4_4_ = days;
  pMStack_10 = this;
  Tm = (tm *)std::chrono::_V2::system_clock::now();
  local_20 = std::chrono::_V2::system_clock::to_time_t((time_point *)&Tm);
  later_time = (time_t)gmtime(&local_20);
  ((tm *)later_time)->tm_mday = ltime._4_4_ + ((tm *)later_time)->tm_mday;
  local_38 = mktime((tm *)later_time);
  later_time = (time_t)gmtime(&local_38);
  iVar1 = ((tm *)later_time)->tm_year;
  pvVar3 = std::array<int,_6UL>::operator[](__return_storage_ptr__,0);
  *pvVar3 = iVar1 + 0x76c;
  iVar1 = *(int *)(later_time + 0x10);
  pvVar3 = std::array<int,_6UL>::operator[](__return_storage_ptr__,1);
  *pvVar3 = iVar1 + 1;
  vVar2 = *(value_type_conflict2 *)(later_time + 0xc);
  pvVar3 = std::array<int,_6UL>::operator[](__return_storage_ptr__,2);
  *pvVar3 = vVar2;
  vVar2 = *(value_type_conflict2 *)(later_time + 8);
  pvVar3 = std::array<int,_6UL>::operator[](__return_storage_ptr__,3);
  *pvVar3 = vVar2;
  vVar2 = *(value_type_conflict2 *)(later_time + 4);
  pvVar3 = std::array<int,_6UL>::operator[](__return_storage_ptr__,4);
  *pvVar3 = vVar2;
  vVar2 = *(value_type_conflict2 *)later_time;
  pvVar3 = std::array<int,_6UL>::operator[](__return_storage_ptr__,5);
  *pvVar3 = vVar2;
  return __return_storage_ptr__;
}

Assistant:

const std::array<int,6> MeteomaticsApiClient::addDayToToday(const int days) const
{
    std::time_t ltime = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
    struct tm *Tm;
    
    Tm=std::gmtime(&ltime);
    
    Tm->tm_mday += days;
    std::time_t later_time = mktime(Tm);
    Tm=std::gmtime(&later_time);
    
    std::array<int,6> tomorrows_time;
    tomorrows_time[0] = Tm->tm_year+1900;
    tomorrows_time[1] = Tm->tm_mon+1;
    tomorrows_time[2] = Tm->tm_mday;
    tomorrows_time[3] = Tm->tm_hour;
    tomorrows_time[4] = Tm->tm_min;
    tomorrows_time[5] = Tm->tm_sec;
    
    return tomorrows_time;
}